

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

bool __thiscall cmGeneratedFileStreamBase::Close(cmGeneratedFileStreamBase *this)

{
  bool bVar1;
  int iVar2;
  cmGeneratedFileStreamBase *this_00;
  string resname;
  string gzname;
  string local_58;
  _Alloc_hider local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)this);
  if ((this->Compress == true) && (this->CompressExtraExtension == true)) {
    std::__cxx11::string::append((char *)&local_58);
  }
  if (((this->Name)._M_string_length == 0) || (this->Okay != true)) {
LAB_00130424:
    bVar1 = false;
  }
  else {
    if (this->CopyIfDifferent == true) {
      bVar1 = cmsys::SystemTools::FilesDiffer(&this->TempName,&local_58);
      if (!bVar1) goto LAB_00130424;
    }
    if (this->Compress == true) {
      this_00 = (cmGeneratedFileStreamBase *)&stack0xffffffffffffffc8;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     &this->TempName,".temp.gz");
      iVar2 = CompressFile(this_00,(this->TempName)._M_dataplus._M_p,local_38._M_p);
      if (iVar2 != 0) {
        cmSystemTools::RenameFile(local_38._M_p,local_58._M_dataplus._M_p);
      }
      cmsys::SystemTools::RemoveFile((string *)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
      bVar1 = true;
    }
    else {
      bVar1 = true;
      cmSystemTools::RenameFile((this->TempName)._M_dataplus._M_p,local_58._M_dataplus._M_p);
    }
  }
  cmsys::SystemTools::RemoveFile(&this->TempName);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

bool cmGeneratedFileStreamBase::Close()
{
  bool replaced = false;

  std::string resname = this->Name;
  if ( this->Compress && this->CompressExtraExtension )
    {
    resname += ".gz";
    }

  // Only consider replacing the destination file if no error
  // occurred.
  if(!this->Name.empty() &&
    this->Okay &&
    (!this->CopyIfDifferent ||
     cmSystemTools::FilesDiffer(this->TempName, resname)))
    {
    // The destination is to be replaced.  Rename the temporary to the
    // destination atomically.
    if ( this->Compress )
      {
      std::string gzname = this->TempName + ".temp.gz";
      if ( this->CompressFile(this->TempName.c_str(), gzname.c_str()) )
        {
        this->RenameFile(gzname.c_str(), resname.c_str());
        }
      cmSystemTools::RemoveFile(gzname);
      }
    else
      {
      this->RenameFile(this->TempName.c_str(), resname.c_str());
      }

    replaced = true;
    }

  // Else, the destination was not replaced.
  //
  // Always delete the temporary file. We never want it to stay around.
  cmSystemTools::RemoveFile(this->TempName);

  return replaced;
}